

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void __thiscall
RegVmLoweredBlock::AddInstruction
          (RegVmLoweredBlock *this,ExpressionContext *ctx,RegVmLoweredInstruction *instruction)

{
  uint uVar1;
  uchar *val;
  SmallArray<unsigned_char,_8U> *this_00;
  uint local_24;
  RegVmLoweredInstruction *pRStack_20;
  uint i;
  RegVmLoweredInstruction *instruction_local;
  ExpressionContext *ctx_local;
  RegVmLoweredBlock *this_local;
  
  pRStack_20 = instruction;
  instruction_local = (RegVmLoweredInstruction *)ctx;
  ctx_local = (ExpressionContext *)this;
  if (instruction == (RegVmLoweredInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x1e,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  if (instruction->parent != (RegVmLoweredBlock *)0x0) {
    __assert_fail("instruction->parent == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x1f,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  if (instruction->prevSibling != (RegVmLoweredInstruction *)0x0) {
    __assert_fail("instruction->prevSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x20,
                  "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
                 );
  }
  if (instruction->nextSibling == (RegVmLoweredInstruction *)0x0) {
    instruction->parent = this;
    if ((instruction->argument != (VmConstant *)0x0) &&
       (instruction->argument->container != (VariableData *)0x0)) {
      SmallArray<RegVmLoweredInstruction_*,_4U>::push_back
                (&instruction->argument->container->regVmUsers,&stack0xffffffffffffffe0);
    }
    if (this->firstInstruction == (RegVmLoweredInstruction *)0x0) {
      this->lastInstruction = pRStack_20;
      this->firstInstruction = pRStack_20;
    }
    else {
      this->lastInstruction->nextSibling = pRStack_20;
      pRStack_20->prevSibling = this->lastInstruction;
      this->lastInstruction = pRStack_20;
    }
    local_24 = 0;
    while( true ) {
      uVar1 = SmallArray<unsigned_char,_16U>::size(&this->parent->killedRegisters);
      if (uVar1 <= local_24) break;
      this_00 = &pRStack_20->preKillRegisters;
      val = SmallArray<unsigned_char,_16U>::operator[](&this->parent->killedRegisters,local_24);
      SmallArray<unsigned_char,_8U>::push_back(this_00,val);
      local_24 = local_24 + 1;
    }
    SmallArray<unsigned_char,_16U>::clear(&this->parent->killedRegisters);
    return;
  }
  __assert_fail("instruction->nextSibling == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0x21,
                "void RegVmLoweredBlock::AddInstruction(ExpressionContext &, RegVmLoweredInstruction *)"
               );
}

Assistant:

void RegVmLoweredBlock::AddInstruction(ExpressionContext &ctx, RegVmLoweredInstruction* instruction)
{
	(void)ctx;

	assert(instruction);
	assert(instruction->parent == NULL);
	assert(instruction->prevSibling == NULL);
	assert(instruction->nextSibling == NULL);

	instruction->parent = this;

	if(instruction->argument && instruction->argument->container)
		instruction->argument->container->regVmUsers.push_back(instruction);

	if(!firstInstruction)
	{
		firstInstruction = lastInstruction = instruction;
	}
	else
	{
		lastInstruction->nextSibling = instruction;
		instruction->prevSibling = lastInstruction;

		lastInstruction = instruction;
	}

	for(unsigned i = 0; i < parent->killedRegisters.size(); i++)
		instruction->preKillRegisters.push_back(parent->killedRegisters[i]);
	parent->killedRegisters.clear();
}